

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

Lazy<bool> __thiscall
cinatra::coro_http_connection::reply(coro_http_connection *this,bool need_to_bufffer)

{
  long lVar1;
  coro_http_connection *this_00;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  byte *pbVar4;
  byte in_DL;
  undefined8 in_RSI;
  LazyBase<bool,_false> in_RDI;
  mutable_buffer mVar5;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  string *in_stack_fffffffffffffdb0;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int iVar6;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdfc;
  coro_http_response *this_01;
  
  puVar3 = (undefined8 *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<bool>::get_return_object_on_allocation_failure();
    return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar3 = reply;
  puVar3[1] = reply;
  this_01 = (coro_http_response *)(puVar3 + 0x11);
  pbVar4 = (byte *)((long)puVar3 + 0xd5);
  puVar3[0x19] = in_RSI;
  *pbVar4 = in_DL & 1;
  async_simple::coro::detail::LazyPromise<bool>::LazyPromise
            ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  async_simple::coro::detail::LazyPromise<bool>::get_return_object
            ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
  bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0xd6));
  if (!bVar2) {
    *(undefined1 *)((long)puVar3 + 0xd4) = 0;
    reply(in_stack_fffffffffffffd70,
          (void *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0xd6));
  uVar7 = 0;
  lVar1 = puVar3[0x19];
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  if ((*(byte *)(lVar1 + 0x1101) & 1) == 0) {
    if ((*pbVar4 & 1) != 0) {
      coro_http_response::build_resp_str
                (this_01,(string *)CONCAT44(in_stack_fffffffffffffdfc,uVar7));
    }
    mVar5 = (mutable_buffer)
            asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    *(mutable_buffer *)(puVar3 + 0xf) = mVar5;
    async_write<asio::mutable_buffers_1>
              ((coro_http_connection *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
               ,(mutable_buffers_1 *)in_stack_fffffffffffffd70);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    bVar2 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar3 + 0x17));
    if (!bVar2) {
      *(undefined1 *)((long)puVar3 + 0xd4) = 2;
      reply((void *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
            (void *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
    }
    puVar3[0x12] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x17);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffd70,
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x179bf8);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x179c05);
  }
  else {
    if ((*pbVar4 & 1) != 0) {
      coro_http_response::to_buffers
                ((coro_http_response *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                 ,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    }
    async_write<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>&>
              ((coro_http_connection *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
               ,in_stack_fffffffffffffd70);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    bVar2 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar3 + 0x15));
    if (!bVar2) {
      *(undefined1 *)((long)puVar3 + 0xd4) = 1;
      reply((void *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
            (void *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
    }
    *(LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> **)this_01 =
         (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar3 + 0x15);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)in_stack_fffffffffffffd70,
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    iVar6 = 0;
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x1799cc);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x1799d9);
    if (iVar6 != 0) goto LAB_00179da0;
  }
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)(puVar3 + 0xd));
  if (bVar2) {
    cerr_logger_t::operator<<
              ((cerr_logger_t *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (char (*) [20])CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    std::error_code::message_abi_cxx11_
              ((error_code *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    cerr_logger_t::operator<<
              ((cerr_logger_t *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    this_00 = (coro_http_connection *)puVar3[0x19];
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x179cbd);
    close(this_00,1);
    async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (bool *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    iVar6 = 3;
  }
  else {
    async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (bool *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    iVar6 = 3;
  }
LAB_00179da0:
  if (iVar6 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)((long)puVar3 + 0xd7));
    if (!bVar2) {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0xd4) = 3;
      reply(in_stack_fffffffffffffd70,
            (void *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      (*(code *)*extraout_RAX_01)(extraout_RAX_01);
      return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
              ((FinalAwaiter *)((long)puVar3 + 0xd7));
  }
  async_simple::coro::detail::LazyPromise<bool>::~LazyPromise((LazyPromise<bool> *)0x179f11);
  if (puVar3 != (undefined8 *)0x0) {
    operator_delete(puVar3,0xd8);
  }
  return (Lazy<bool>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<bool> reply(bool need_to_bufffer = true) {
    std::error_code ec;
    size_t size;
    if (multi_buf_) {
      if (need_to_bufffer) {
        response_.to_buffers(buffers_, chunk_size_str_);
      }
      std::tie(ec, size) = co_await async_write(buffers_);
    }
    else {
      if (need_to_bufffer) {
        response_.build_resp_str(resp_str_);
      }
      std::tie(ec, size) = co_await async_write(asio::buffer(resp_str_));
    }

    if (ec) {
      CINATRA_LOG_ERROR << "async_write error: " << ec.message();
      close();
      co_return false;
    }

    co_return true;
  }